

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O1

void Ssw_ReportOutputs(Aig_Man_t *pAig)

{
  void *pvVar1;
  char *pcVar2;
  ulong uVar3;
  Aig_Man_t *pAVar4;
  long lVar5;
  
  uVar3 = (ulong)(uint)pAig->nTruePos;
  pAVar4 = pAig;
  if (0 < pAig->nTruePos) {
    lVar5 = 0;
    do {
      if (pAig->vCos->nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCos->pArray[lVar5];
      pcVar2 = "1tPD cq[:P tqS[ [qS& Sq[Vt Sq[c Sq[lt Sq[: VqlSt[ Squ[ tq[P( tq+[P [qDtP( c";
      if (lVar5 < (long)(int)uVar3 - (long)pAig->nConstrs) {
        pcVar2 = "o;# o+& ;#oB a;o& 5;o# o>& o5;#B >&oa Q;o# +Qo& T;o# +To& p;o# p>o& opT;# o";
      }
      Abc_Print((int)pAVar4,pcVar2 + 0x4a);
      pAVar4 = pAig;
      Ssw_ReportOneOutput(pAig,*(Aig_Obj_t **)((long)pvVar1 + 8));
      lVar5 = lVar5 + 1;
      uVar3 = (ulong)pAig->nTruePos;
    } while (lVar5 < (long)uVar3);
  }
  Abc_Print((int)pAVar4,"\n");
  return;
}

Assistant:

void Ssw_ReportOutputs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
            Abc_Print( 1, "o" );
        else
            Abc_Print( 1, "c" );
        Ssw_ReportOneOutput( pAig, Aig_ObjChild0(pObj) );
    }
    Abc_Print( 1, "\n" );
}